

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O0

void __thiscall cmCTestBuildHandler::LaunchHelper::WriteLauncherConfig(LaunchHelper *this)

{
  cmCTest *this_00;
  ostream *poVar1;
  allocator<char> local_2e9;
  string local_2e8;
  undefined1 local_2c8 [8];
  string srcdir;
  undefined1 local_298 [8];
  cmGeneratedFileStream fout;
  string fname;
  LaunchHelper *this_local;
  
  WriteScrapeMatchers(this,"Warning",&this->Handler->ReallyCustomWarningMatches);
  WriteScrapeMatchers(this,"WarningSuppress",&this->Handler->ReallyCustomWarningExceptions);
  cmStrCat<std::__cxx11::string&,char_const(&)[25]>
            ((string *)&fout.field_0x260,&this->Handler->CTestLaunchDir,
             (char (*) [25])"/CTestLaunchConfig.cmake");
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_298,(string *)&fout.field_0x260,false,None);
  this_00 = this->CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,"SourceDirectory",&local_2e9);
  cmCTest::GetCTestConfiguration((string *)local_2c8,this_00,&local_2e8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  poVar1 = std::operator<<((ostream *)local_298,"set(CTEST_SOURCE_DIRECTORY \"");
  poVar1 = std::operator<<(poVar1,(string *)local_2c8);
  std::operator<<(poVar1,"\")\n");
  std::__cxx11::string::~string((string *)local_2c8);
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
  std::__cxx11::string::~string((string *)&fout.field_0x260);
  return;
}

Assistant:

void cmCTestBuildHandler::LaunchHelper::WriteLauncherConfig()
{
  this->WriteScrapeMatchers("Warning",
                            this->Handler->ReallyCustomWarningMatches);
  this->WriteScrapeMatchers("WarningSuppress",
                            this->Handler->ReallyCustomWarningExceptions);

  // Give some testing configuration information to the launcher.
  std::string fname =
    cmStrCat(this->Handler->CTestLaunchDir, "/CTestLaunchConfig.cmake");
  cmGeneratedFileStream fout(fname);
  std::string srcdir = this->CTest->GetCTestConfiguration("SourceDirectory");
  fout << "set(CTEST_SOURCE_DIRECTORY \"" << srcdir << "\")\n";
}